

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O3

void * calloc(size_t __nmemb,size_t __size)

{
  void *p;
  long in_FS_OFFSET;
  
  if (libc_calloc == (CALLOC_FUNCTION)0x0) {
    if (*(int *)(in_FS_OFFSET + -4) != 0) {
      static_calloc(unsigned_long)::memory_pool._0_8_ =
           (ulong)((uint)(__size * __nmemb) & 7) + __size * __nmemb;
      static_calloc(unsigned_long)::memory_pool[9] = 0x2b;
      return static_calloc(unsigned_long)::memory_pool + 10;
    }
    printf("wait for smtinit_sem %s %d\n","calloc",0x223);
    malloc_hook();
  }
  p = (*libc_calloc)(__nmemb,__size);
  if ((p != (void *)0x0) && (*(int *)(in_FS_OFFSET + -8) == 0)) {
    tr_where('+',p,__size * __nmemb);
  }
  return p;
}

Assistant:

void* calloc(size_t nitems, size_t size)
{
    void* r = 0;
    if (!libc_calloc) {
        if (calloc_for_dlsym)
            return static_calloc(nitems*size);
        SMTLOG("wait for smtinit_sem %s %d\n", __FUNCTION__, __LINE__);
        malloc_hook();
    }
    r = libc_calloc(nitems, size);
    if (!use_origin_malloc && r)
        tr_where('+', r, nitems*size);
    return r;
}